

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::LogFormat::updateDateFormat(LogFormat *this,size_t index,string_t *currFormat)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  stringstream ss;
  int count;
  char_t *ptr;
  FormatFlags in_stack_fffffffffffffddc;
  LogFormat *in_stack_fffffffffffffde0;
  char *pcVar5;
  allocator local_201;
  string local_200 [32];
  string local_1e0 [48];
  stringstream local_1b0 [16];
  ostream local_1a0 [380];
  int local_24;
  char *local_20;
  ulong local_18;
  ulong local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = hasFlag(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
  if (bVar1) {
    sVar2 = strlen(consts::kDateTimeFormatSpecifier);
    local_10 = sVar2 + local_10;
  }
  lVar3 = std::__cxx11::string::c_str();
  local_20 = (char *)(lVar3 + local_10);
  uVar4 = std::__cxx11::string::size();
  if ((local_10 < uVar4) && (*local_20 == '{')) {
    local_20 = local_20 + 1;
    local_24 = 1;
    std::__cxx11::stringstream::stringstream(local_1b0);
    for (; *local_20 != '\0'; local_20 = local_20 + 1) {
      if (*local_20 == '}') {
        local_24 = local_24 + 1;
        break;
      }
      std::operator<<(local_1a0,*local_20);
      local_24 = local_24 + 1;
    }
    std::__cxx11::string::erase(local_18,local_10);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)(in_RDI + 0x50),local_1e0);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  else {
    bVar1 = hasFlag(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    if (bVar1) {
      pcVar5 = consts::kDefaultDateTimeFormat;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,pcVar5,&local_201);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x50),local_200);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
    }
  }
  return;
}

Assistant:

void LogFormat::updateDateFormat(std::size_t index, base::type::string_t& currFormat) {
  if (hasFlag(base::FormatFlags::DateTime)) {
    index += ELPP_STRLEN(base::consts::kDateTimeFormatSpecifier);
  }
  const base::type::char_t* ptr = currFormat.c_str() + index;
  if ((currFormat.size() > index) && (ptr[0] == '{')) {
    // User has provided format for date/time
    ++ptr;
    int count = 1;  // Start by 1 in order to remove starting brace
    std::stringstream ss;
    for (; *ptr; ++ptr, ++count) {
      if (*ptr == '}') {
        ++count;  // In order to remove ending brace
        break;
      }
      ss << static_cast<char>(*ptr);
    }
    currFormat.erase(index, count);
    m_dateTimeFormat = ss.str();
  } else {
    // No format provided, use default
    if (hasFlag(base::FormatFlags::DateTime)) {
      m_dateTimeFormat = std::string(base::consts::kDefaultDateTimeFormat);
    }
  }
}